

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ImageLoadAndStoreCase::iterate
          (ImageLoadAndStoreCase *this)

{
  ostringstream *poVar1;
  ushort uVar2;
  ChannelType CVar3;
  ChannelType CVar4;
  TestLog *log;
  pointer pPVar5;
  bool bVar6;
  bool bVar7;
  GLenum target;
  Float<unsigned_short,_5,_10,_15,_3U> FVar8;
  int i;
  int iVar9;
  deUint32 dVar10;
  deUint32 format;
  int iVar11;
  int iVar12;
  ContextType type;
  GLSLVersion version;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char *pcVar14;
  undefined8 *puVar15;
  long *plVar16;
  TextureFormat *pTVar17;
  int extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined8 uVar18;
  RenderContext *renderContext;
  long *plVar19;
  TextureFormat TVar20;
  ulong *puVar21;
  TextureFormat TVar22;
  void *pvVar23;
  TextureFormat *format_00;
  uint x;
  int iVar24;
  int iVar25;
  long lVar26;
  void *__src;
  uint uVar27;
  undefined1 isSampler;
  ulong uVar28;
  ulong uVar29;
  void *pvVar30;
  uint uVar31;
  ImageLoadAndStoreCase *pIVar32;
  uint y;
  TextureType formatType;
  bool bVar33;
  float fVar34;
  undefined4 uVar35;
  IVec3 local_840;
  uint local_834;
  RenderContext *local_830;
  void *local_828;
  void *local_820;
  ImageLoadAndStoreCase *local_818;
  void *local_810;
  void *local_808;
  long *local_800;
  long local_7f8;
  long local_7f0;
  long lStack_7e8;
  CallLogWrapper glLog;
  ulong *local_7c8;
  long local_7c0;
  ulong local_7b8;
  undefined8 uStack_7b0;
  TestLog *local_7a8;
  void *local_7a0;
  long *local_798 [2];
  long local_788 [2];
  Vector<int,_4> res_3;
  long local_768;
  int aiStack_760 [2];
  TextureFormat *local_758;
  ulong local_750;
  void *local_748;
  void *local_740;
  undefined1 local_738 [16];
  ulong local_728;
  TextureFormat TStack_720;
  deUint32 local_718;
  GLenum local_714;
  ulong *local_710;
  long local_708;
  ulong local_700 [2];
  long *local_6f0;
  undefined8 local_6e8;
  long local_6e0;
  undefined8 uStack_6d8;
  PixelBufferAccess sliceAccess;
  Vector<float,_4> res;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_690;
  string shaderImageTypeStr;
  Texture texture1;
  Texture texture0;
  string local_628;
  long *local_608;
  long local_600;
  long local_5f8;
  long lStack_5f0;
  long *local_5e8;
  long local_5e0;
  long local_5d8;
  long lStack_5d0;
  long *local_5c8;
  long local_5c0;
  long local_5b8;
  long lStack_5b0;
  long *local_5a8;
  long local_5a0;
  long local_598;
  long lStack_590;
  long *local_588;
  long local_580;
  long local_578;
  long lStack_570;
  long *local_568;
  long local_560;
  long local_558;
  long lStack_550;
  long *local_548;
  long local_540;
  long local_538;
  long lStack_530;
  long *local_528;
  long local_520;
  long local_518;
  long lStack_510;
  long *local_508;
  long local_500;
  long local_4f8;
  long lStack_4f0;
  long *local_4e8;
  long local_4e0;
  long local_4d8;
  long lStack_4d0;
  long *local_4c8;
  long local_4c0;
  long local_4b8;
  long lStack_4b0;
  long *local_4a8;
  long local_4a0;
  long local_498;
  long lStack_490;
  long *local_488;
  long local_480;
  long local_478;
  long lStack_470;
  long *local_468;
  long local_460;
  long local_458;
  long lStack_450;
  string shaderImageFormatStr;
  Buffer texture1Buf;
  LayeredImage reference;
  string glslVersionDeclaration;
  Buffer texture0Buf;
  IVec4 color;
  undefined1 auStack_340 [8];
  _Rb_tree_node_base local_338;
  size_t local_318;
  ios_base local_2e8 [8];
  ios_base local_2e0 [264];
  Vector<float,_4> res_1;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_148;
  undefined1 local_128 [32];
  Vector<float,_4> res_2;
  GLuint local_70;
  bool local_48;
  
  local_830 = ((this->super_TestCase).m_context)->m_renderCtx;
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  iVar9 = (*local_830->_vptr_RenderContext[3])();
  local_7a8 = log;
  glu::CallLogWrapper::CallLogWrapper(&glLog,(Functions *)CONCAT44(extraout_var,iVar9),log);
  dVar10 = glu::getInternalFormat(this->m_textureFormat);
  format = glu::getInternalFormat(this->m_imageFormat);
  uVar28 = (ulong)this->m_textureType;
  local_714 = 0xffffffff;
  if (uVar28 < 8) {
    local_714 = *(GLenum *)(&DAT_00984784 + uVar28 * 4);
  }
  switch(uVar28) {
  case 0:
  case 1:
    local_840.m_data._0_8_ = 0x4000000040;
    goto LAB_004442bb;
  case 2:
  case 3:
    local_840.m_data[0] = 0x40;
    local_840.m_data[1] = 0x40;
    local_840.m_data[2] = 8;
    break;
  default:
    local_840.m_data[2] = 0xffffffff;
    local_840.m_data[0] = -1;
    local_840.m_data[1] = -1;
    break;
  case 7:
    local_840.m_data._0_8_ = 0x100000040;
LAB_004442bb:
    local_840.m_data[2] = 1;
  }
  iVar24 = local_840.m_data[2];
  iVar9 = local_840.m_data[0];
  iVar12 = local_840.m_data[1];
  uVar31 = local_840.m_data[2];
  if (local_840.m_data[2] < local_840.m_data[1]) {
    uVar31 = local_840.m_data[1];
  }
  if ((int)uVar31 < local_840.m_data[0]) {
    uVar31 = local_840.m_data[0];
  }
  CVar3 = (this->m_textureFormat).type;
  if ((CVar3 < UNORM_BYTE_44) && ((0x58U >> (CVar3 & UNSIGNED_INT16) & 1) != 0)) {
    fVar34 = 1.0;
LAB_00444311:
    fVar34 = fVar34 / (float)(int)(uVar31 - 1);
  }
  else {
    if (CVar3 < UNORM_INT8) {
      fVar34 = 2.0;
      goto LAB_00444311;
    }
    fVar34 = 1.0;
  }
  if (CVar3 < UNORM_INT8) {
    uVar35 = 0xbf800000;
  }
  else {
    uVar35 = 0;
  }
  local_828 = (void *)CONCAT44(local_828._4_4_,uVar35);
  local_834 = 6;
  if (this->m_textureType != TEXTURETYPE_CUBE) {
    local_834 = local_840.m_data[2];
  }
  if ((UNSIGNED_INT32 < CVar3) || (bVar33 = true, (0x2c0000000U >> ((ulong)CVar3 & 0x3f) & 1) == 0))
  {
    bVar33 = CVar3 - SIGNED_INT8 < 3;
  }
  local_718 = dVar10;
  iVar11 = (*local_830->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&texture0Buf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar11),pOVar13)
  ;
  iVar11 = (*local_830->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&texture1Buf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar11),pOVar13)
  ;
  iVar11 = (*local_830->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture0.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_02,iVar11),pOVar13);
  iVar11 = (*local_830->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&texture1.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_03,iVar11),pOVar13);
  LayeredImage::LayeredImage
            (&reference,this->m_textureType,&this->m_textureFormat,iVar9,iVar12,iVar24);
  glLog.m_enableLog = true;
  poVar1 = (ostringstream *)(color.m_data + 2);
  color.m_data._0_8_ = local_7a8;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"// Created 2 textures (names ",0x1d);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," and ",5);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2e0);
  local_818 = this;
  if (this->m_textureType == TEXTURETYPE_BUFFER) {
    poVar1 = (ostringstream *)(color.m_data + 2);
    color.m_data._0_8_ = local_7a8;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"// Created buffers for the textures (names ",0x2b);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," and ",5);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,")",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_2e0);
  }
  if (0 < (int)local_834) {
    iVar9 = local_840.m_data[0];
    local_820 = (void *)CONCAT44(local_820._4_4_,local_840.m_data[1]);
    uVar31 = 0;
    do {
      if (0 < (int)(uint)local_820) {
        y = 0;
        do {
          if (0 < iVar9) {
            uVar27 = ~y + (uint)local_820 ^ uVar31;
            x = 0;
            do {
              color.m_data[1] = y ^ uVar31 ^ ~x + iVar9;
              color.m_data[0] = y ^ uVar31 ^ x;
              color.m_data[3] = ~x + iVar9 ^ uVar27;
              color.m_data[2] = uVar27 ^ x;
              if (bVar33) {
                (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<int,4>>
                          ((LayeredImage *)&reference,x,y,uVar31,&color);
              }
              else {
                res.m_data[0] = 0.0;
                res.m_data[1] = 0.0;
                res.m_data[2] = 0.0;
                res.m_data[3] = 0.0;
                lVar26 = 0;
                do {
                  res.m_data[lVar26] = (float)color.m_data[lVar26];
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 4);
                res_1.m_data[0] = 0.0;
                res_1.m_data[1] = 0.0;
                res_1.m_data[2] = 0.0;
                res_1.m_data[3] = 0.0;
                lVar26 = 0;
                do {
                  res_1.m_data[lVar26] = res.m_data[lVar26] * fVar34;
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 4);
                res_2.m_data[0] = 0.0;
                res_2.m_data[1] = 0.0;
                res_2.m_data[2] = 0.0;
                res_2.m_data[3] = 0.0;
                lVar26 = 0;
                do {
                  res_2.m_data[lVar26] = res_1.m_data[lVar26] + local_828._0_4_;
                  lVar26 = lVar26 + 1;
                } while (lVar26 != 4);
                (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                          ((LayeredImage *)&reference,x,y,uVar31,&res_2);
              }
              x = x + 1;
            } while (x != iVar9);
          }
          y = y + 1;
        } while (y != (uint)local_820);
      }
      uVar31 = uVar31 + 1;
    } while (uVar31 != local_834);
  }
  pTVar17 = &local_818->m_imageFormat;
  CVar3 = (local_818->m_textureFormat).type;
  CVar4 = (local_818->m_imageFormat).type;
  local_758 = pTVar17;
  if (CVar3 == HALF_FLOAT || CVar4 != HALF_FLOAT) {
    if (CVar3 != FLOAT && CVar4 == FLOAT) {
      iVar12 = tcu::TextureFormat::getPixelSize(pTVar17);
      iVar9 = 1;
      if (pTVar17->order != R) {
        iVar9 = (uint)(pTVar17->order == RGBA) << 2;
      }
      uVar31 = 6;
      if (reference.m_type != TEXTURETYPE_CUBE) {
        uVar31 = reference.m_size.m_data[2];
      }
      if (0 < (int)uVar31) {
        local_808 = (void *)(ulong)uVar31;
        pvVar23 = (void *)0x0;
        do {
          local_810 = pvVar23;
          if (reference.m_type == TEXTURETYPE_CUBE) {
            pPVar5 = (reference.m_texCube.m_ptr)->m_access[(long)pvVar23].
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            color.m_data._0_8_ = (pPVar5->super_ConstPixelBufferAccess).m_format;
            color.m_data._8_8_ = *(undefined8 *)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data
            ;
            auStack_340._4_4_ = (pPVar5->super_ConstPixelBufferAccess).m_pitch.m_data[2];
            auStack_340._0_4_ =
                 (undefined4)
                 ((ulong)*(undefined8 *)(pPVar5->super_ConstPixelBufferAccess).m_pitch.m_data >>
                 0x20);
            local_338._0_8_ = (pPVar5->super_ConstPixelBufferAccess).m_data;
          }
          else {
            LayeredImage::getSliceAccessInternal
                      ((PixelBufferAccess *)&color,&reference,(int)pvVar23);
          }
          if (0 < reference.m_size.m_data[1]) {
            local_828 = (void *)CONCAT44(local_828._4_4_,auStack_340._0_4_);
            local_820 = (void *)local_338._0_8_;
            uVar28 = 0;
            do {
              if (0 < reference.m_size.m_data[0]) {
                uVar29 = 0;
                do {
                  if (iVar9 != 0) {
                    lVar26 = (long)(iVar12 * (int)uVar29) + (long)(auStack_340._0_4_ * (int)uVar28);
                    iVar11 = 0;
                    iVar24 = iVar9;
                    do {
                      uVar31 = *(uint *)(local_338._0_8_ + iVar11 / iVar9 + lVar26);
                      if (((uVar31 & 0x7fffffff) == 0x7f800000) ||
                         ((uVar31 & 0x7fffff) != 0 &&
                          ((uVar31 & 0x7f800000) == 0 || (uVar31 & 0x7f800000) == 0x7f800000))) {
                        *(undefined4 *)(local_338._0_8_ + iVar11 / iVar9 + lVar26) = 0;
                      }
                      iVar11 = iVar11 + iVar12;
                      iVar24 = iVar24 + -1;
                    } while (iVar24 != 0);
                  }
                  uVar29 = uVar29 + 1;
                } while (uVar29 != (uint)reference.m_size.m_data[0]);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != (uint)reference.m_size.m_data[1]);
          }
          pvVar23 = (void *)((long)local_810 + 1);
        } while (pvVar23 != local_808);
      }
    }
  }
  else {
    iVar12 = tcu::TextureFormat::getPixelSize(pTVar17);
    iVar9 = 1;
    if (pTVar17->order != R) {
      iVar9 = (uint)(pTVar17->order == RGBA) << 2;
    }
    uVar31 = 6;
    if (reference.m_type != TEXTURETYPE_CUBE) {
      uVar31 = reference.m_size.m_data[2];
    }
    if (0 < (int)uVar31) {
      local_820 = (void *)(ulong)(uint)reference.m_size.m_data[0];
      local_7a0 = (void *)(ulong)(uint)reference.m_size.m_data[1];
      uVar28 = 0;
      do {
        local_750 = uVar28;
        if (reference.m_type == TEXTURETYPE_CUBE) {
          pPVar5 = (reference.m_texCube.m_ptr)->m_access[uVar28].
                   super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          color.m_data._0_8_ = (pPVar5->super_ConstPixelBufferAccess).m_format;
          color.m_data._8_8_ = *(undefined8 *)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data;
          auStack_340._4_4_ = (pPVar5->super_ConstPixelBufferAccess).m_pitch.m_data[2];
          auStack_340._0_4_ =
               (undefined4)
               ((ulong)*(undefined8 *)(pPVar5->super_ConstPixelBufferAccess).m_pitch.m_data >> 0x20)
          ;
          local_338._0_8_ = (pPVar5->super_ConstPixelBufferAccess).m_data;
        }
        else {
          LayeredImage::getSliceAccessInternal((PixelBufferAccess *)&color,&reference,(int)uVar28);
        }
        if (0 < (int)local_7a0) {
          local_740 = (void *)CONCAT44(local_740._4_4_,auStack_340._0_4_);
          local_748 = (void *)local_338._0_8_;
          local_808 = (void *)0x0;
          do {
            if (0 < (int)(uint)local_820) {
              local_810 = (void *)((long)((int)local_740 * (int)local_808) + (long)local_748);
              local_828 = (void *)0x0;
              do {
                pvVar23 = local_810;
                if (iVar9 != 0) {
                  iVar11 = iVar12 * (int)local_828._0_4_;
                  iVar25 = 0;
                  iVar24 = iVar9;
                  do {
                    uVar2 = *(ushort *)((long)pvVar23 + (long)(iVar25 / iVar9) + (long)iVar11);
                    if (((uVar2 & 0x7fff) == 0x7c00) ||
                       ((uVar2 & 0x3ff) != 0 &&
                        ((uVar2 & 0x7c00) == 0 || (uVar2 & 0x7c00) == 0x7c00))) {
                      res_2.m_data._0_8_ = res_2.m_data._0_8_ & 0xffffffff00000000;
                      FVar8 = tcu::Float<unsigned_short,5,10,15,3u>::
                              convert<unsigned_int,8,23,127,3u>
                                        ((Float<unsigned_int,_8,_23,_127,_3U> *)&res_2);
                      *(StorageType *)((long)pvVar23 + (long)(iVar25 / iVar9) + (long)iVar11) =
                           FVar8.m_value;
                    }
                    iVar25 = iVar25 + iVar12;
                    iVar24 = iVar24 + -1;
                  } while (iVar24 != 0);
                }
                local_828 = (void *)((long)local_828 + 1);
              } while (local_828 != local_820);
            }
            local_808 = (void *)((long)local_808 + 1);
          } while (local_808 != local_7a0);
        }
        uVar28 = local_750 + 1;
      } while (uVar28 != uVar31);
    }
  }
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c0);
  target = local_714;
  pTVar17 = local_758;
  glu::CallLogWrapper::glBindTexture(&glLog,local_714,texture0.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,target);
  poVar1 = (ostringstream *)(color.m_data + 2);
  color.m_data._0_8_ = local_7a8;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// Filling texture ",0x13);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," with xor pattern",0x11);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&color,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_2e0);
  uploadTexture(&glLog,&reference,texture0Buf.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::glActiveTexture(&glLog,0x84c1);
  glu::CallLogWrapper::glBindTexture(&glLog,target,texture1.super_ObjectWrapper.m_object);
  setTexParameteri(&glLog,target);
  isSampler = (undefined1)texture1Buf.super_ObjectWrapper.m_object;
  setTextureStorage(&glLog,local_818->m_textureType,local_718,&local_840,
                    texture1Buf.super_ObjectWrapper.m_object);
  pIVar32 = local_818;
  getShaderImageFormatQualifier_abi_cxx11_(&shaderImageFormatStr,(Functional *)pTVar17,format_00);
  formatType = pIVar32->m_textureType;
  uVar28 = (ulong)formatType;
  if ((pIVar32->m_singleLayerBind == true) &&
     (bVar6 = formatType < TEXTURETYPE_LAST, formatType = TEXTURETYPE_LAST, bVar6)) {
    formatType = *(TextureType *)(&DAT_00984764 + uVar28 * 4);
  }
  renderContext = (RenderContext *)0x0;
  getShaderSamplerOrImageType_abi_cxx11_
            (&shaderImageTypeStr,(Functional *)(ulong)(pIVar32->m_imageFormat).type,formatType,
             TEXTURETYPE_2D,(bool)isSampler);
  type.super_ApiType.m_bits = (ApiType)(*local_830->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  pcVar14 = glu::getGLSLVersionDeclaration(version);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&glslVersionDeclaration,pcVar14,(allocator<char> *)&color);
  local_128[0x10] = 0;
  local_128._17_8_ = 0;
  local_128._0_8_ = (pointer)0x0;
  local_128[8] = 0;
  local_128._9_7_ = 0;
  memset(&res_1,0,0xac);
  local_710 = local_700;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_710,glslVersionDeclaration._M_dataplus._M_p,
             glslVersionDeclaration._M_dataplus._M_p + glslVersionDeclaration._M_string_length);
  std::__cxx11::string::append((char *)&local_710);
  textureTypeExtensionShaderRequires_abi_cxx11_
            (&local_628,(Functional *)(ulong)formatType,(TextureType)local_830,renderContext);
  uVar28 = 0xf;
  if (local_710 != local_700) {
    uVar28 = local_700[0];
  }
  if (uVar28 < local_628._M_string_length + local_708) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_628._M_dataplus._M_p != &local_628.field_2) {
      uVar18 = local_628.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_628._M_string_length + local_708) goto LAB_00444dce;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_628,0,(char *)0x0,(ulong)local_710);
  }
  else {
LAB_00444dce:
    puVar15 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_710,(ulong)local_628._M_dataplus._M_p);
  }
  local_6f0 = &local_6e0;
  plVar16 = puVar15 + 2;
  if ((long *)*puVar15 == plVar16) {
    local_6e0 = *plVar16;
    uStack_6d8 = puVar15[3];
  }
  else {
    local_6e0 = *plVar16;
    local_6f0 = (long *)*puVar15;
  }
  local_6e8 = puVar15[1];
  *puVar15 = plVar16;
  puVar15[1] = 0;
  *(undefined1 *)plVar16 = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_6f0);
  local_608 = &local_5f8;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_5f8 = *plVar19;
    lStack_5f0 = plVar16[3];
  }
  else {
    local_5f8 = *plVar19;
    local_608 = (long *)*plVar16;
  }
  local_600 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_608,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_5e8 = &local_5d8;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_5d8 = *plVar19;
    lStack_5d0 = plVar16[3];
  }
  else {
    local_5d8 = *plVar19;
    local_5e8 = (long *)*plVar16;
  }
  local_5e0 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_5e8);
  local_5c8 = &local_5b8;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_5b8 = *plVar19;
    lStack_5b0 = plVar16[3];
  }
  else {
    local_5b8 = *plVar19;
    local_5c8 = (long *)*plVar16;
  }
  local_5c0 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_5c8,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  local_5a8 = &local_598;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_598 = *plVar19;
    lStack_590 = plVar16[3];
  }
  else {
    local_598 = *plVar19;
    local_5a8 = (long *)*plVar16;
  }
  local_5a0 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_5a8);
  local_588 = &local_578;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_578 = *plVar19;
    lStack_570 = plVar16[3];
  }
  else {
    local_578 = *plVar19;
    local_588 = (long *)*plVar16;
  }
  local_580 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_588);
  local_568 = &local_558;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_558 = *plVar19;
    lStack_550 = plVar16[3];
  }
  else {
    local_558 = *plVar19;
    local_568 = (long *)*plVar16;
  }
  local_560 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_568);
  local_548 = &local_538;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_538 = *plVar19;
    lStack_530 = plVar16[3];
  }
  else {
    local_538 = *plVar19;
    local_548 = (long *)*plVar16;
  }
  local_540 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_548,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_528 = &local_518;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_518 = *plVar19;
    lStack_510 = plVar16[3];
  }
  else {
    local_518 = *plVar19;
    local_528 = (long *)*plVar16;
  }
  local_520 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_528);
  local_508 = &local_4f8;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_4f8 = *plVar19;
    lStack_4f0 = plVar16[3];
  }
  else {
    local_4f8 = *plVar19;
    local_508 = (long *)*plVar16;
  }
  local_500 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_508,(ulong)shaderImageFormatStr._M_dataplus._M_p);
  local_4e8 = &local_4d8;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_4d8 = *plVar19;
    lStack_4d0 = plVar16[3];
  }
  else {
    local_4d8 = *plVar19;
    local_4e8 = (long *)*plVar16;
  }
  local_4e0 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_4e8);
  local_4c8 = &local_4b8;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_4b8 = *plVar19;
    lStack_4b0 = plVar16[3];
  }
  else {
    local_4b8 = *plVar19;
    local_4c8 = (long *)*plVar16;
  }
  local_4c0 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_4c8);
  local_4a8 = &local_498;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_498 = *plVar19;
    lStack_490 = plVar16[3];
  }
  else {
    local_498 = *plVar19;
    local_4a8 = (long *)*plVar16;
  }
  local_4a0 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_4a8);
  local_488 = &local_478;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_478 = *plVar19;
    lStack_470 = plVar16[3];
  }
  else {
    local_478 = *plVar19;
    local_488 = (long *)*plVar16;
  }
  local_480 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_488,(ulong)shaderImageTypeStr._M_dataplus._M_p);
  local_468 = &local_458;
  plVar19 = plVar16 + 2;
  if ((long *)*plVar16 == plVar19) {
    local_458 = *plVar19;
    lStack_450 = plVar16[3];
  }
  else {
    local_458 = *plVar19;
    local_468 = (long *)*plVar16;
  }
  local_460 = plVar16[1];
  *plVar16 = (long)plVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  pTVar17 = (TextureFormat *)std::__cxx11::string::append((char *)&local_468);
  TVar20 = (TextureFormat)(pTVar17 + 2);
  if (*pTVar17 == TVar20) {
    local_728 = *(ulong *)TVar20;
    TStack_720 = pTVar17[3];
    local_738._0_8_ = &local_728;
  }
  else {
    local_728 = *(ulong *)TVar20;
    local_738._0_8_ = *pTVar17;
  }
  local_738._8_8_ = pTVar17[1];
  *pTVar17 = TVar20;
  pTVar17[1].order = R;
  pTVar17[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar17[2].order = R;
  iVar9 = local_840.m_data[0];
  if (formatType == TEXTURETYPE_BUFFER) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&color);
    std::ostream::operator<<(&color,iVar9 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&color);
    std::ios_base::~ios_base(local_2e8);
    plVar16 = (long *)std::__cxx11::string::replace((ulong)local_798,0,(char *)0x0,0x98349f);
    local_800 = &local_7f0;
    plVar19 = plVar16 + 2;
    if ((long *)*plVar16 == plVar19) {
      local_7f0 = *plVar19;
      lStack_7e8 = plVar16[3];
    }
    else {
      local_7f0 = *plVar19;
      local_800 = (long *)*plVar16;
    }
    local_7f8 = plVar16[1];
    *plVar16 = (long)plVar19;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
    local_7c8 = &local_7b8;
    puVar21 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar21) {
      local_7b8 = *puVar21;
      uStack_7b0 = puVar15[3];
    }
    else {
      local_7b8 = *puVar21;
      local_7c8 = (ulong *)*puVar15;
    }
    local_7c0 = puVar15[1];
    *puVar15 = puVar21;
    bVar6 = false;
LAB_0044561a:
    bVar7 = false;
  }
  else {
    if (2 < formatType - TEXTURETYPE_CUBE) {
      if (formatType != TEXTURETYPE_2D) {
        local_7c8 = &local_7b8;
        uVar18 = std::__throw_logic_error("basic_string::_M_construct null not valid");
        if ((ulong *)local_738._0_8_ != &local_728) {
          operator_delete((void *)local_738._0_8_,local_728 + 1);
        }
        if (local_468 != &local_458) {
          operator_delete(local_468,local_458 + 1);
        }
        if (local_488 != &local_478) {
          operator_delete(local_488,local_478 + 1);
        }
        if (local_4a8 != &local_498) {
          operator_delete(local_4a8,local_498 + 1);
        }
        if (local_4c8 != &local_4b8) {
          operator_delete(local_4c8,local_4b8 + 1);
        }
        if (local_4e8 != &local_4d8) {
          operator_delete(local_4e8,local_4d8 + 1);
        }
        if (local_508 != &local_4f8) {
          operator_delete(local_508,local_4f8 + 1);
        }
        if (local_528 != &local_518) {
          operator_delete(local_528,local_518 + 1);
        }
        if (local_548 != &local_538) {
          operator_delete(local_548,local_538 + 1);
        }
        if (local_568 != &local_558) {
          operator_delete(local_568,local_558 + 1);
        }
        if (local_588 != &local_578) {
          operator_delete(local_588,local_578 + 1);
        }
        if (local_5a8 != &local_598) {
          operator_delete(local_5a8,local_598 + 1);
        }
        if (local_5c8 != &local_5b8) {
          operator_delete(local_5c8,local_5b8 + 1);
        }
        if (local_5e8 != &local_5d8) {
          operator_delete(local_5e8,local_5d8 + 1);
        }
        if (local_608 != &local_5f8) {
          operator_delete(local_608,local_5f8 + 1);
        }
        if (local_6f0 != &local_6e0) {
          operator_delete(local_6f0,local_6e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_628._M_dataplus._M_p != &local_628.field_2) {
          operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
        }
        if (local_710 != local_700) {
          operator_delete(local_710,local_700[0] + 1);
        }
        glu::ProgramSources::~ProgramSources((ProgramSources *)&res_1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
          operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                          glslVersionDeclaration.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
          operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                          shaderImageTypeStr.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
          operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                          shaderImageFormatStr.field_2._M_allocated_capacity + 1);
        }
        LayeredImage::~LayeredImage(&reference);
        glu::ObjectWrapper::~ObjectWrapper(&texture1.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&texture0.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&texture1Buf.super_ObjectWrapper);
        glu::ObjectWrapper::~ObjectWrapper(&texture0Buf.super_ObjectWrapper);
        glu::CallLogWrapper::~CallLogWrapper(&glLog);
        _Unwind_Resume(uVar18);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&color);
      std::ostream::operator<<(&color,iVar9 + -1);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&color);
      std::ios_base::~ios_base(local_2e8);
      puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)local_798,0,(char *)0x0,0x983501)
      ;
      local_800 = &local_7f0;
      plVar16 = puVar15 + 2;
      if ((long *)*puVar15 == plVar16) {
        local_7f0 = *plVar16;
        lStack_7e8 = puVar15[3];
      }
      else {
        local_7f0 = *plVar16;
        local_800 = (long *)*puVar15;
      }
      local_7f8 = puVar15[1];
      *puVar15 = plVar16;
      puVar15[1] = 0;
      *(undefined1 *)(puVar15 + 2) = 0;
      puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
      local_7c8 = &local_7b8;
      puVar21 = puVar15 + 2;
      if ((ulong *)*puVar15 == puVar21) {
        local_7b8 = *puVar21;
        uStack_7b0 = puVar15[3];
      }
      else {
        local_7b8 = *puVar21;
        local_7c8 = (ulong *)*puVar15;
      }
      local_7c0 = puVar15[1];
      *puVar15 = puVar21;
      bVar6 = true;
      goto LAB_0044561a;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&color);
    std::ostream::operator<<(&color,iVar9 + -1);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&color);
    std::ios_base::~ios_base(local_2e8);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)local_798,0,(char *)0x0,0x983578);
    local_800 = &local_7f0;
    plVar16 = puVar15 + 2;
    if ((long *)*puVar15 == plVar16) {
      local_7f0 = *plVar16;
      lStack_7e8 = puVar15[3];
    }
    else {
      local_7f0 = *plVar16;
      local_800 = (long *)*puVar15;
    }
    local_7f8 = puVar15[1];
    *puVar15 = plVar16;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_800);
    local_7c8 = &local_7b8;
    puVar21 = puVar15 + 2;
    if ((ulong *)*puVar15 == puVar21) {
      local_7b8 = *puVar21;
      uStack_7b0 = puVar15[3];
    }
    else {
      local_7b8 = *puVar21;
      local_7c8 = (ulong *)*puVar15;
    }
    local_7c0 = puVar15[1];
    *puVar15 = puVar21;
    bVar7 = true;
    bVar6 = false;
  }
  puVar15[1] = 0;
  *(undefined1 *)puVar21 = 0;
  uVar28 = 0xf;
  if ((ulong *)local_738._0_8_ != &local_728) {
    uVar28 = local_728;
  }
  if (uVar28 < (ulong)(local_7c0 + local_738._8_8_)) {
    uVar28 = 0xf;
    if (local_7c8 != &local_7b8) {
      uVar28 = local_7b8;
    }
    if ((ulong)(local_7c0 + local_738._8_8_) <= uVar28) {
      puVar15 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_7c8,0,(char *)0x0,local_738._0_8_);
      goto LAB_00445721;
    }
  }
  puVar15 = (undefined8 *)std::__cxx11::string::_M_append(local_738,(ulong)local_7c8);
LAB_00445721:
  res_3.m_data._0_8_ = &local_768;
  plVar16 = puVar15 + 2;
  if ((long *)*puVar15 == plVar16) {
    local_768 = *plVar16;
    aiStack_760 = (int  [2])puVar15[3];
  }
  else {
    local_768 = *plVar16;
    res_3.m_data._0_8_ = (long *)*puVar15;
  }
  res_3.m_data._8_8_ = puVar15[1];
  *puVar15 = plVar16;
  puVar15[1] = 0;
  *(undefined1 *)plVar16 = 0;
  pTVar17 = (TextureFormat *)std::__cxx11::string::append((char *)&res_3);
  TVar20 = (TextureFormat)(sliceAccess.super_ConstPixelBufferAccess.m_size.m_data + 2);
  TVar22 = (TextureFormat)(pTVar17 + 2);
  if (*pTVar17 == TVar22) {
    sliceAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = *(int *)TVar22;
    sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] = pTVar17[2].type;
    sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] = pTVar17[3].order;
    sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = pTVar17[3].type;
    sliceAccess.super_ConstPixelBufferAccess.m_format = TVar20;
  }
  else {
    sliceAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = (int)*(long *)TVar22;
    sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
         (int)((ulong)*(long *)TVar22 >> 0x20);
    sliceAccess.super_ConstPixelBufferAccess.m_format = *pTVar17;
  }
  sliceAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = pTVar17[1];
  *pTVar17 = TVar22;
  pTVar17[1].order = R;
  pTVar17[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar17[2].order = R;
  res.m_data[0] = 7.00649e-45;
  res.m_data._8_8_ = &local_690;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(res.m_data + 2),sliceAccess.super_ConstPixelBufferAccess.m_format,
             sliceAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
             (long)sliceAccess.super_ConstPixelBufferAccess.m_format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&res_1 + (res.m_data._0_8_ & 0xffffffff) * 0x18),
              (value_type *)(res.m_data + 2));
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)&res_2,local_830,(ProgramSources *)&res_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)res.m_data._8_8_ != &local_690) {
    operator_delete((void *)res.m_data._8_8_,local_690._M_allocated_capacity + 1);
  }
  if (sliceAccess.super_ConstPixelBufferAccess.m_format != TVar20) {
    operator_delete((void *)sliceAccess.super_ConstPixelBufferAccess.m_format,
                    CONCAT44(sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0],
                             sliceAccess.super_ConstPixelBufferAccess.m_size.m_data[2]) + 1);
  }
  if ((long *)res_3.m_data._0_8_ != &local_768) {
    operator_delete((void *)res_3.m_data._0_8_,local_768 + 1);
  }
  if (local_7c8 != &local_7b8) {
    operator_delete(local_7c8,local_7b8 + 1);
  }
  if (bVar7) {
    if (local_800 != &local_7f0) {
      operator_delete(local_800,local_7f0 + 1);
    }
    if (local_798[0] != local_788) {
      operator_delete(local_798[0],local_788[0] + 1);
    }
  }
  if (bVar6) {
    if (local_800 != &local_7f0) {
      operator_delete(local_800,local_7f0 + 1);
    }
    if (local_798[0] != local_788) {
      operator_delete(local_798[0],local_788[0] + 1);
    }
  }
  if (formatType == TEXTURETYPE_BUFFER) {
    if (local_800 != &local_7f0) {
      operator_delete(local_800,local_7f0 + 1);
    }
    if (local_798[0] != local_788) {
      operator_delete(local_798[0],local_788[0] + 1);
    }
  }
  if ((ulong *)local_738._0_8_ != &local_728) {
    operator_delete((void *)local_738._0_8_,local_728 + 1);
  }
  if (local_468 != &local_458) {
    operator_delete(local_468,local_458 + 1);
  }
  if (local_488 != &local_478) {
    operator_delete(local_488,local_478 + 1);
  }
  if (local_4a8 != &local_498) {
    operator_delete(local_4a8,local_498 + 1);
  }
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8,local_4b8 + 1);
  }
  if (local_4e8 != &local_4d8) {
    operator_delete(local_4e8,local_4d8 + 1);
  }
  if (local_508 != &local_4f8) {
    operator_delete(local_508,local_4f8 + 1);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528,local_518 + 1);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,local_538 + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,local_558 + 1);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588,local_578 + 1);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,local_598 + 1);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8,local_5b8 + 1);
  }
  if (local_5e8 != &local_5d8) {
    operator_delete(local_5e8,local_5d8 + 1);
  }
  if (local_608 != &local_5f8) {
    operator_delete(local_608,local_5f8 + 1);
  }
  if (local_6f0 != &local_6e0) {
    operator_delete(local_6f0,local_6e0 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if (local_710 != local_700) {
    operator_delete(local_710,local_700[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_128);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_148);
  lVar26 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)res_1.m_data + lVar26));
    lVar26 = lVar26 + -0x18;
  } while (lVar26 != -0x18);
  color.m_data[0] = (*local_830->_vptr_RenderContext[3])();
  color.m_data[1] = extraout_var_04;
  local_338._M_left = &local_338;
  color.m_data._8_8_ = local_7a8;
  local_338._0_8_ = local_338._0_8_ & 0xffffffff00000000;
  local_338._M_parent = (_Base_ptr)0x0;
  local_318 = 0;
  local_338._M_right = local_338._M_left;
  glu::operator<<(local_7a8,(ShaderProgram *)&res_2);
  local_750 = CONCAT71(local_750._1_7_,local_48);
  if (local_48 == false) {
    tcu::TestContext::setTestResult
              ((local_818->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_FAIL,"Program compilation failed");
  }
  else {
    glu::CallLogWrapper::glUseProgram(&glLog,local_70);
    if (local_818->m_singleLayerBind == true) {
      if (0 < (int)local_834) {
        iVar9 = local_840.m_data[0];
        iVar12 = local_840.m_data[1];
        uVar31 = 0;
        do {
          if (uVar31 != 0) {
            glu::CallLogWrapper::glMemoryBarrier(&glLog,0x20);
          }
          glu::CallLogWrapper::glBindImageTexture
                    (&glLog,0,texture0.super_ObjectWrapper.m_object,0,'\0',uVar31,35000,format);
          iVar24 = (*local_830->_vptr_RenderContext[3])();
          dVar10 = (**(code **)(CONCAT44(extraout_var_05,iVar24) + 0x800))();
          glu::checkError(dVar10,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                          ,0x5c4);
          glu::CallLogWrapper::glBindImageTexture
                    (&glLog,1,texture1.super_ObjectWrapper.m_object,0,'\0',uVar31,0x88b9,format);
          iVar24 = (*local_830->_vptr_RenderContext[3])();
          dVar10 = (**(code **)(CONCAT44(extraout_var_06,iVar24) + 0x800))();
          glu::checkError(dVar10,"glBindImageTexture",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                          ,0x5c7);
          glu::CallLogWrapper::glDispatchCompute(&glLog,iVar9,iVar12,1);
          iVar24 = (*local_830->_vptr_RenderContext[3])();
          dVar10 = (**(code **)(CONCAT44(extraout_var_07,iVar24) + 0x800))();
          glu::checkError(dVar10,"glDispatchCompute",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                          ,0x5ca);
          uVar31 = uVar31 + 1;
        } while (local_834 != uVar31);
      }
    }
    else {
      glu::CallLogWrapper::glBindImageTexture
                (&glLog,0,texture0.super_ObjectWrapper.m_object,0,'\x01',0,35000,format);
      iVar9 = (*local_830->_vptr_RenderContext[3])();
      dVar10 = (**(code **)(CONCAT44(extraout_var_08,iVar9) + 0x800))();
      glu::checkError(dVar10,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d0);
      glu::CallLogWrapper::glBindImageTexture
                (&glLog,1,texture1.super_ObjectWrapper.m_object,0,'\x01',0,0x88b9,format);
      iVar9 = (*local_830->_vptr_RenderContext[3])();
      dVar10 = (**(code **)(CONCAT44(extraout_var_09,iVar9) + 0x800))();
      glu::checkError(dVar10,"glBindImageTexture",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d3);
      glu::CallLogWrapper::glDispatchCompute
                (&glLog,local_840.m_data[0],local_840.m_data[1],local_834);
      iVar9 = (*local_830->_vptr_RenderContext[3])();
      dVar10 = (**(code **)(CONCAT44(extraout_var_10,iVar9) + 0x800))();
      glu::checkError(dVar10,"glDispatchCompute",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fShaderImageLoadStoreTests.cpp"
                      ,0x5d6);
    }
    pTVar17 = local_758;
    pIVar32 = local_818;
    if (((local_818->m_textureFormat).order != (local_818->m_imageFormat).order) ||
       ((local_818->m_textureFormat).type != (local_818->m_imageFormat).type)) {
      iVar9 = tcu::TextureFormat::getPixelSize(local_758);
      tcu::TextureLevel::TextureLevel((TextureLevel *)&res_1,pTVar17,1,1,1);
      tcu::TextureLevel::getAccess((PixelBufferAccess *)&res,(TextureLevel *)&res_1);
      if (0 < (int)local_834) {
        local_820 = (void *)(local_840.m_data._0_8_ & 0xffffffff);
        local_810 = (void *)((ulong)local_840.m_data._0_8_ >> 0x20);
        local_748 = (void *)(ulong)local_834;
        pvVar23 = (void *)0x0;
        do {
          local_740 = pvVar23;
          if (pIVar32->m_textureType == TEXTURETYPE_CUBE) {
            pTVar17 = (TextureFormat *)
                      (reference.m_texCube.m_ptr)->m_access[(long)pvVar23].
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            sliceAccess.super_ConstPixelBufferAccess.m_format = *pTVar17;
            sliceAccess.super_ConstPixelBufferAccess.m_size.m_data[2] = pTVar17[2].order;
            sliceAccess.super_ConstPixelBufferAccess.m_size.m_data._0_8_ = pTVar17[1];
            sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[2] = pTVar17[3].type;
            sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[0] =
                 (int)*(undefined8 *)&pTVar17[2].type;
            sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1] =
                 (int)((ulong)*(undefined8 *)&pTVar17[2].type >> 0x20);
            sliceAccess.super_ConstPixelBufferAccess.m_data = *(void **)(pTVar17 + 4);
          }
          else {
            LayeredImage::getSliceAccessInternal(&sliceAccess,&reference,(int)pvVar23);
          }
          if (0 < (int)local_810) {
            local_808 = (void *)CONCAT44(local_808._4_4_,
                                         sliceAccess.super_ConstPixelBufferAccess.m_pitch.m_data[1])
            ;
            local_7a0 = sliceAccess.super_ConstPixelBufferAccess.m_data;
            local_828 = (void *)0x0;
            do {
              pvVar23 = local_7a0;
              if (0 < (int)(uint)local_820) {
                iVar12 = (int)local_808 * (int)local_828._0_4_;
                iVar24 = 0;
                pvVar30 = local_820;
                do {
                  __src = (void *)((long)pvVar23 + (long)iVar24 + (long)iVar12);
                  memcpy((void *)local_690._8_8_,__src,(long)iVar9);
                  CVar3 = (local_818->m_imageFormat).type;
                  iVar11 = (int)(PixelBufferAccess *)&res;
                  if ((((ulong)CVar3 < 0x22) && ((0x2c0000000U >> ((ulong)CVar3 & 0x3f) & 1) != 0))
                     || (CVar3 - SIGNED_INT8 < 3)) {
                    tcu::ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)local_738,iVar11,0,0);
                    res_3.m_data[0] = local_738._0_4_;
                    res_3.m_data[1] = local_738._4_4_;
                    res_3.m_data[2] = local_738._8_4_;
                    res_3.m_data[3] = local_738._12_4_;
                    tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&res,&res_3,0,0,0);
                  }
                  else {
                    tcu::ConstPixelBufferAccess::getPixel
                              ((ConstPixelBufferAccess *)&res_3,iVar11,0,0);
                    tcu::PixelBufferAccess::setPixel((PixelBufferAccess *)&res,(Vec4 *)&res_3,0,0,0)
                    ;
                  }
                  memcpy(__src,(void *)local_690._8_8_,(long)iVar9);
                  iVar24 = iVar24 + iVar9;
                  pvVar30 = (void *)((long)pvVar30 - 1);
                } while (pvVar30 != (void *)0x0);
              }
              local_828 = (void *)((long)local_828 + 1);
            } while (local_828 != local_810);
          }
          pvVar23 = (void *)((long)local_740 + 1);
          pIVar32 = local_818;
        } while (pvVar23 != local_748);
      }
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&res_1);
    }
    if (0 < (int)local_834) {
      local_820 = (void *)(local_840.m_data._0_8_ & 0xffffffff);
      local_828 = (void *)CONCAT44(local_828._4_4_,local_840.m_data[1]);
      iVar9 = local_840.m_data[0] / 2;
      local_810 = (void *)CONCAT44(local_810._4_4_,local_840.m_data[0] + -1);
      uVar31 = 0;
      do {
        if (0 < (int)local_828._0_4_) {
          iVar12 = 0;
          do {
            if (1 < (int)(uint)local_820) {
              iVar11 = 0;
              iVar24 = (int)local_810;
              do {
                iVar25 = (int)&reference;
                if (bVar33) {
                  LayeredImage::getPixelInt((LayeredImage *)&res_1,iVar25,iVar24,iVar12);
                  LayeredImage::getPixelInt((LayeredImage *)&res,iVar25,iVar11,iVar12);
                  (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<unsigned_int,4>>
                            ((LayeredImage *)&reference,iVar24,iVar12,uVar31,
                             (Vector<unsigned_int,_4> *)&res);
                  (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<unsigned_int,4>>
                            ((LayeredImage *)&reference,iVar11,iVar12,uVar31,
                             (Vector<unsigned_int,_4> *)&res_1);
                }
                else {
                  LayeredImage::getPixel((LayeredImage *)&res_1,iVar25,iVar24,iVar12);
                  LayeredImage::getPixel((LayeredImage *)&res,iVar25,iVar11,iVar12);
                  (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                            ((LayeredImage *)&reference,iVar24,iVar12,uVar31,&res);
                  (anonymous_namespace)::LayeredImage::setPixel<tcu::Vector<float,4>>
                            ((LayeredImage *)&reference,iVar11,iVar12,uVar31,&res_1);
                }
                iVar11 = iVar11 + 1;
                iVar24 = iVar24 + -1;
              } while (iVar9 != iVar11);
            }
            iVar12 = iVar12 + 1;
          } while ((float)iVar12 != local_828._0_4_);
        }
        uVar31 = uVar31 + 1;
      } while (uVar31 != local_834);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               *)auStack_340);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&res_2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)glslVersionDeclaration._M_dataplus._M_p != &glslVersionDeclaration.field_2) {
    operator_delete(glslVersionDeclaration._M_dataplus._M_p,
                    glslVersionDeclaration.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageTypeStr._M_dataplus._M_p != &shaderImageTypeStr.field_2) {
    operator_delete(shaderImageTypeStr._M_dataplus._M_p,
                    shaderImageTypeStr.field_2._M_allocated_capacity + 1);
  }
  pIVar32 = local_818;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)shaderImageFormatStr._M_dataplus._M_p != &shaderImageFormatStr.field_2) {
    operator_delete(shaderImageFormatStr._M_dataplus._M_p,
                    shaderImageFormatStr.field_2._M_allocated_capacity + 1);
  }
  if ((char)local_750 != '\0') {
    color.m_data._0_8_ = &PTR_operator___00b4a1d0;
    color.m_data._8_8_ = &reference;
    bVar33 = readTextureAndVerify
                       (local_830,&glLog,texture1.super_ObjectWrapper.m_object,
                        texture1Buf.super_ObjectWrapper.m_object,pIVar32->m_textureType,
                        &this->m_textureFormat,&local_840,(ImageLayerVerifier *)&color);
    pcVar14 = "Image comparison failed";
    if (bVar33) {
      pcVar14 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((pIVar32->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar33,
               pcVar14);
  }
  LayeredImage::~LayeredImage(&reference);
  glu::ObjectWrapper::~ObjectWrapper(&texture1.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture0.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture1Buf.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&texture0Buf.super_ObjectWrapper);
  glu::CallLogWrapper::~CallLogWrapper(&glLog);
  return STOP;
}

Assistant:

ImageLoadAndStoreCase::IterateResult ImageLoadAndStoreCase::iterate (void)
{
	const RenderContext&		renderCtx					= m_context.getRenderContext();
	TestLog&					log							(m_testCtx.getLog());
	glu::CallLogWrapper			glLog						(renderCtx.getFunctions(), log);
	const deUint32				textureInternalFormatGL		= glu::getInternalFormat(m_textureFormat);
	const deUint32				imageInternalFormatGL		= glu::getInternalFormat(m_imageFormat);
	const deUint32				textureTargetGL				= getGLTextureTarget(m_textureType);
	const IVec3&				imageSize					= defaultImageSize(m_textureType);
	const int					maxImageDimension			= de::max(imageSize.x(), de::max(imageSize.y(), imageSize.z()));
	const float					storeColorScale				= isFormatTypeUnorm(m_textureFormat.type) ? 1.0f / (float)(maxImageDimension - 1)
															: isFormatTypeSnorm(m_textureFormat.type) ? 2.0f / (float)(maxImageDimension - 1)
															: 1.0f;
	const float					storeColorBias				= isFormatTypeSnorm(m_textureFormat.type) ? -1.0f : 0.0f;
	const int					numSlicesOrFaces			= m_textureType == TEXTURETYPE_CUBE ? 6 : imageSize.z();
	const bool					isIntegerTextureFormat		= isFormatTypeInteger(m_textureFormat.type);
	const glu::Buffer			texture0Buf					(renderCtx);
	const glu::Buffer			texture1Buf					(renderCtx);
	const glu::Texture			texture0					(renderCtx);
	const glu::Texture			texture1					(renderCtx);
	LayeredImage				reference					(m_textureType, m_textureFormat, imageSize.x(), imageSize.y(), imageSize.z());

	glLog.enableLogging(true);

	// Setup textures.

	log << TestLog::Message << "// Created 2 textures (names " << *texture0 << " and " << *texture1 << ")" << TestLog::EndMessage;
	if (m_textureType == TEXTURETYPE_BUFFER)
		log << TestLog::Message << "// Created buffers for the textures (names " << *texture0Buf << " and " << *texture1Buf << ")" << TestLog::EndMessage;

	// First, fill reference with (a fairly arbitrary) initial pattern. This will be used as texture upload source data as well as for actual reference computation later on.

	DE_ASSERT(!isIntegerTextureFormat || (storeColorScale == 1.0f && storeColorBias == 0.0f));

	for (int z = 0; z < numSlicesOrFaces; z++)
	for (int y = 0; y < imageSize.y(); y++)
	for (int x = 0; x < imageSize.x(); x++)
	{
		const IVec4 color(x^y^z, (imageSize.x()-1-x)^y^z, x^(imageSize.y()-1-y)^z, (imageSize.x()-1-x)^(imageSize.y()-1-y)^z);

		if (isIntegerTextureFormat)
			reference.setPixel(x, y, z, color);
		else
			reference.setPixel(x, y, z, color.asFloat()*storeColorScale + storeColorBias);
	}

	// If re-interpreting the texture contents as floating point values, need to get rid of inf, nan etc.
	if (m_imageFormat.type == TextureFormat::HALF_FLOAT && m_textureFormat.type != TextureFormat::HALF_FLOAT)
		replaceBadFloatReinterpretValues<TextureFormat::HALF_FLOAT, tcu::Float16, deUint16>(reference, m_imageFormat);
	else if (m_imageFormat.type == TextureFormat::FLOAT && m_textureFormat.type != TextureFormat::FLOAT)
		replaceBadFloatReinterpretValues<TextureFormat::FLOAT, tcu::Float32, deUint32>(reference, m_imageFormat);

	// Upload initial pattern to texture 0.

	glLog.glActiveTexture(GL_TEXTURE0);
	glLog.glBindTexture(textureTargetGL, *texture0);
	setTexParameteri(glLog, textureTargetGL);

	log << TestLog::Message << "// Filling texture " << *texture0 << " with xor pattern" << TestLog::EndMessage;

	uploadTexture(glLog, reference, *texture0Buf);

	// Set storage for texture 1.

	glLog.glActiveTexture(GL_TEXTURE1);
	glLog.glBindTexture(textureTargetGL, *texture1);
	setTexParameteri(glLog, textureTargetGL);
	setTextureStorage(glLog, m_textureType, textureInternalFormatGL, imageSize, *texture1Buf);

	// Perform image loads and stores in compute shader and finalize reference computation.

	{
		// Generate compute shader.

		const char* const		maybeRestrict			= m_restrictImages ? "restrict" : "";
		const string			shaderImageFormatStr	= getShaderImageFormatQualifier(m_imageFormat);
		const TextureType		shaderImageType			= m_singleLayerBind ? textureLayerType(m_textureType) : m_textureType;
		const string			shaderImageTypeStr		= getShaderImageType(m_imageFormat.type, shaderImageType);
		const std::string		glslVersionDeclaration	= glu::getGLSLVersionDeclaration(glu::getContextTypeGLSLVersion(renderCtx.getType()));

		const glu::ShaderProgram program(renderCtx,
			glu::ProgramSources() << glu::ComputeSource(glslVersionDeclaration + "\n"
														+ textureTypeExtensionShaderRequires(shaderImageType, renderCtx) +
														"\n"
														"precision highp " + shaderImageTypeStr + ";\n"
														"\n"
														"layout (local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
														"layout (" + shaderImageFormatStr + ", binding=0) " + maybeRestrict + " readonly uniform " + shaderImageTypeStr + " u_image0;\n"
														"layout (" + shaderImageFormatStr + ", binding=1) " + maybeRestrict + " writeonly uniform " + shaderImageTypeStr + " u_image1;\n"
														"\n"
														"void main (void)\n"
														"{\n"
														+ (shaderImageType == TEXTURETYPE_BUFFER ?
															"	int pos = int(gl_GlobalInvocationID.x);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, " + toString(imageSize.x()-1) + "-pos));\n"
														 : shaderImageType == TEXTURETYPE_2D ?
															"	ivec2 pos = ivec2(gl_GlobalInvocationID.xy);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, ivec2(" + toString(imageSize.x()-1) + "-pos.x, pos.y)));\n"
														 : shaderImageType == TEXTURETYPE_3D || shaderImageType == TEXTURETYPE_CUBE || shaderImageType == TEXTURETYPE_2D_ARRAY ?
															"	ivec3 pos = ivec3(gl_GlobalInvocationID);\n"
															"	imageStore(u_image1, pos, imageLoad(u_image0, ivec3(" + toString(imageSize.x()-1) + "-pos.x, pos.y, pos.z)));\n"
														 : DE_NULL) +
														"}\n"));

		UniformAccessLogger uniforms(renderCtx.getFunctions(), log, program.getProgram());

		log << program;

		if (!program.isOk())
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Program compilation failed");
			return STOP;
		}

		// Setup and dispatch.

		glLog.glUseProgram(program.getProgram());

		if (m_singleLayerBind)
		{
			for (int layerNdx = 0; layerNdx < numSlicesOrFaces; layerNdx++)
			{
				if (layerNdx > 0)
					glLog.glMemoryBarrier(GL_SHADER_IMAGE_ACCESS_BARRIER_BIT);

				glLog.glBindImageTexture(0, *texture0, 0, GL_FALSE, layerNdx, GL_READ_ONLY, imageInternalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glBindImageTexture(1, *texture1, 0, GL_FALSE, layerNdx, GL_WRITE_ONLY, imageInternalFormatGL);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

				glLog.glDispatchCompute(imageSize.x(), imageSize.y(), 1);
				GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
			}
		}
		else
		{
			glLog.glBindImageTexture(0, *texture0, 0, GL_TRUE, 0, GL_READ_ONLY, imageInternalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glBindImageTexture(1, *texture1, 0, GL_TRUE, 0, GL_WRITE_ONLY, imageInternalFormatGL);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glBindImageTexture");

			glLog.glDispatchCompute(imageSize.x(), imageSize.y(), numSlicesOrFaces);
			GLU_EXPECT_NO_ERROR(renderCtx.getFunctions().getError(), "glDispatchCompute");
		}

		// Finalize reference.

		if (m_textureFormat != m_imageFormat)
		{
			// Format re-interpretation case. Read data with image format and write back, with the same image format.
			// We do this because the data may change a little during lookups (e.g. unorm8 -> float; not all unorms can be exactly represented as floats).

			const int					pixelSize		= m_imageFormat.getPixelSize();
			tcu::TextureLevel			scratch			(m_imageFormat, 1, 1);
			const PixelBufferAccess		scratchAccess	= scratch.getAccess();

			for (int z = 0; z < numSlicesOrFaces; z++)
			{
				const PixelBufferAccess		sliceAccess		= m_textureType == TEXTURETYPE_CUBE ? reference.getCubeFaceAccess((tcu::CubeFace)z) : reference.getSliceAccess(z);
				const int					rowPitch		= sliceAccess.getRowPitch();
				void *const					data			= sliceAccess.getDataPtr();

				for (int y = 0; y < imageSize.y(); y++)
				for (int x = 0; x < imageSize.x(); x++)
				{
					void *const pixelData = (deUint8*)data + y*rowPitch + x*pixelSize;

					deMemcpy(scratchAccess.getDataPtr(), pixelData, pixelSize);

					if (isFormatTypeInteger(m_imageFormat.type))
						scratchAccess.setPixel(scratchAccess.getPixelUint(0, 0), 0, 0);
					else
						scratchAccess.setPixel(scratchAccess.getPixel(0, 0), 0, 0);

					deMemcpy(pixelData, scratchAccess.getDataPtr(), pixelSize);
				}
			}
		}

		for (int z = 0; z < numSlicesOrFaces; z++)
		for (int y = 0; y < imageSize.y(); y++)
		for (int x = 0; x < imageSize.x()/2; x++)
		{
			if (isIntegerTextureFormat)
			{
				const UVec4 temp = reference.getPixelUint(imageSize.x()-1-x, y, z);
				reference.setPixel(imageSize.x()-1-x, y, z, reference.getPixelUint(x, y, z));
				reference.setPixel(x, y, z, temp);
			}
			else
			{
				const Vec4 temp = reference.getPixel(imageSize.x()-1-x, y, z);
				reference.setPixel(imageSize.x()-1-x, y, z, reference.getPixel(x, y, z));
				reference.setPixel(x, y, z, temp);
			}
		}
	}

	// Read texture 1 and compare to reference.

	const bool compareOk = readTextureAndVerify(renderCtx, glLog, *texture1, *texture1Buf, m_textureType, m_textureFormat, imageSize, ImageLayerComparer(reference));

	m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, compareOk ? "Pass" : "Image comparison failed");
	return STOP;
}